

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miam-core.c
# Opt level: O2

void la_miam_core_format_json(la_vstring *vstr,void *data)

{
  if (*data != 0) {
    la_miam_errors_format_json(vstr,(uint)*data);
    return;
  }
  la_json_append_int64(vstr,"version",(ulong)*(byte *)((long)data + 4));
  la_json_append_int64(vstr,"pdu_type",(ulong)*(uint *)((long)data + 8));
  return;
}

Assistant:

void la_miam_core_format_json(la_vstring *vstr, void const *data) {
	la_assert(vstr);
	la_assert(data);

	la_miam_core_pdu const *pdu = data;
	if(pdu->err & LA_MIAM_ERR_HDR) {
		la_miam_errors_format_json(vstr, pdu->err & LA_MIAM_ERR_HDR);
		return;
	}
	la_json_append_int64(vstr, "version", pdu->version);
	la_json_append_int64(vstr, "pdu_type", pdu->pdu_type);
}